

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double get_prediction_decay_rate(FIRSTPASS_STATS *frame_stats)

{
  FIRSTPASS_STATS *in_RDI;
  double zero_motion_factor;
  double sr_decay_rate;
  double local_20;
  double local_18;
  
  local_20 = get_sr_decay_rate(in_RDI);
  local_18 = (in_RDI->pcnt_inter - in_RDI->pcnt_motion) * 0.5;
  if (local_18 <= 1.0) {
    if (local_18 < 0.0) {
      local_18 = 0.0;
    }
  }
  else {
    local_18 = 1.0;
  }
  if (local_18 <= (1.0 - local_20) * local_18 + local_20) {
    local_20 = (1.0 - local_20) * local_18 + local_20;
  }
  else {
    local_20 = local_18;
  }
  return local_20;
}

Assistant:

static double get_prediction_decay_rate(const FIRSTPASS_STATS *frame_stats) {
  const double sr_decay_rate = get_sr_decay_rate(frame_stats);
  double zero_motion_factor =
      DEFAULT_ZM_FACTOR * (frame_stats->pcnt_inter - frame_stats->pcnt_motion);

  // Clamp value to range 0.0 to 1.0
  // This should happen anyway if input values are sensibly clamped but checked
  // here just in case.
  if (zero_motion_factor > 1.0)
    zero_motion_factor = 1.0;
  else if (zero_motion_factor < 0.0)
    zero_motion_factor = 0.0;

  return AOMMAX(zero_motion_factor,
                (sr_decay_rate + ((1.0 - sr_decay_rate) * zero_motion_factor)));
}